

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

void __thiscall ByteCodeGenerator::AddTargetStmt(ByteCodeGenerator *this,ParseNodeStmt *pnodeStmt)

{
  Type *ppFVar1;
  FuncInfo *top;
  ParseNodeStmt *pnodeStmt_local;
  ByteCodeGenerator *this_local;
  
  ppFVar1 = SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Top(this->funcInfoStack);
  FuncInfo::AddTargetStmt(*ppFVar1,pnodeStmt);
  return;
}

Assistant:

void ByteCodeGenerator::AddTargetStmt(ParseNodeStmt *pnodeStmt)
{
    FuncInfo *top = funcInfoStack->Top();
    top->AddTargetStmt(pnodeStmt);
}